

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

int __thiscall amrex::MLMG::bottomSolveWithCG(MLMG *this,Any *x,Any *b,Type type)

{
  int iVar1;
  ostream *os_;
  MLCGSolver local_1e0;
  Print local_1b0;
  
  MLCGSolver::MLCGSolver(&local_1e0,this,this->linop,BiCGStab);
  local_1e0.verbose = this->bottom_verbose;
  local_1e0.maxiter = this->bottom_maxiter;
  local_1e0.solver_type = type;
  if (this->cf_strategy == ghostnodes) {
    local_1e0.nghost = (*this->linop->_vptr_MLLinOp[6])(this->linop,0,0);
  }
  iVar1 = MLCGSolver::solve(&local_1e0,x,b,this->bottom_reltol,this->bottom_abstol);
  if ((iVar1 != 0) && (1 < this->verbose)) {
    os_ = OutStream();
    Print::Print(&local_1b0,os_);
    std::operator<<((ostream *)&local_1b0.ss,"MLMG: Bottom solve failed.\n");
    Print::~Print(&local_1b0);
  }
  local_1b0.rank = local_1e0.iter;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->m_niters_cg).super_vector<int,_std::allocator<int>_>,&local_1b0.rank);
  MLCGSolver::~MLCGSolver(&local_1e0);
  return iVar1;
}

Assistant:

int
MLMG::bottomSolveWithCG (Any& x, const Any& b, MLCGSolver::Type type)
{
    MLCGSolver cg_solver(this, linop);
    cg_solver.setSolver(type);
    cg_solver.setVerbose(bottom_verbose);
    cg_solver.setMaxIter(bottom_maxiter);
    if (cf_strategy == CFStrategy::ghostnodes) cg_solver.setNGhost(linop.getNGrow());

    int ret = cg_solver.solve(x, b, bottom_reltol, bottom_abstol);
    if (ret != 0 && verbose > 1) {
        amrex::Print() << "MLMG: Bottom solve failed.\n";
    }
    m_niters_cg.push_back(cg_solver.getNumIters());
    return ret;
}